

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

size_t write_insn(MIR_context_t ctx,writer_func_t writer,MIR_func_t func,MIR_insn_t_conflict insn)

{
  ulong uVar1;
  MIR_insn_code_t code_00;
  int iVar2;
  MIR_error_func_t p_Var3;
  size_t sVar4;
  size_t sVar5;
  MIR_context_t local_50;
  size_t len;
  MIR_insn_code_t code;
  size_t nops;
  size_t i;
  MIR_insn_t_conflict insn_local;
  MIR_func_t func_local;
  writer_func_t writer_local;
  MIR_context_t ctx_local;
  
  uVar1 = *(ulong *)&insn->field_0x18;
  code_00 = (MIR_insn_code_t)uVar1;
  if (((code_00 == MIR_UNSPEC) || (code_00 == MIR_USE)) || (code_00 == MIR_PHI)) {
    p_Var3 = MIR_get_error_func(ctx);
    (*p_Var3)(MIR_binary_io_error,"UNSPEC, USE, or PHI is not portable and can not be output");
  }
  if (code_00 == MIR_LABEL) {
    ctx_local = (MIR_context_t)write_lab(ctx,writer,insn);
  }
  else {
    sVar4 = MIR_insn_nops(ctx,insn);
    local_50 = (MIR_context_t)write_uint(ctx,writer,uVar1 & 0xffffffff);
    for (nops = 0; nops < sVar4; nops = nops + 1) {
      sVar5 = write_op(ctx,writer,func,insn->ops[nops]);
      local_50 = (MIR_context_t)((long)&local_50->gen_ctx + sVar5);
    }
    if (insn_descs[uVar1 & 0xffffffff].op_modes[0] == '\r') {
      iVar2 = MIR_call_code_p(code_00);
      if (((iVar2 == 0) && (code_00 != MIR_RET)) && (code_00 != MIR_SWITCH)) {
        __assert_fail("MIR_call_code_p (code) || code == MIR_RET || code == MIR_SWITCH",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                      ,0x1326,
                      "size_t write_insn(MIR_context_t, writer_func_t, MIR_func_t, MIR_insn_t)");
      }
      put_byte(ctx,writer,0x3d);
      local_50 = (MIR_context_t)((long)&local_50->gen_ctx + 1);
    }
    ctx->io_ctx->output_insns_len = (long)&local_50->gen_ctx + ctx->io_ctx->output_insns_len;
    ctx_local = local_50;
  }
  return (size_t)ctx_local;
}

Assistant:

static size_t write_insn (MIR_context_t ctx, writer_func_t writer, MIR_func_t func,
                          MIR_insn_t insn) {
  size_t i, nops;
  MIR_insn_code_t code = insn->code;
  size_t len;

  if (code == MIR_UNSPEC || code == MIR_USE || code == MIR_PHI)
    MIR_get_error_func (ctx) (MIR_binary_io_error,
                              "UNSPEC, USE, or PHI is not portable and can not be output");
  if (code == MIR_LABEL) return write_lab (ctx, writer, insn);
  nops = MIR_insn_nops (ctx, insn);
  len = write_uint (ctx, writer, code);
  for (i = 0; i < nops; i++) len += write_op (ctx, writer, func, insn->ops[i]);
  if (insn_descs[code].op_modes[0] == MIR_OP_BOUND) {
    /* first operand mode is undefined if it is a variable operand insn */
    mir_assert (MIR_call_code_p (code) || code == MIR_RET || code == MIR_SWITCH);
    put_byte (ctx, writer, TAG_EOI);
    len++;
  }
  output_insns_len += len;
  return len;
}